

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inproc.c
# Opt level: O3

int inproc_ep_bind(void *arg,nng_url *url)

{
  int iVar1;
  undefined8 *item;
  
  nni_mtx_lock(&nni_inproc.mx);
  item = (undefined8 *)nni_list_first(&nni_inproc.servers);
  do {
    if (item == (undefined8 *)0x0) {
      nni_list_append(&nni_inproc.servers,arg);
      iVar1 = 0;
LAB_00128d32:
      nni_mtx_unlock(&nni_inproc.mx);
      return iVar1;
    }
    iVar1 = strcmp((char *)*item,*arg);
    if (iVar1 == 0) {
      iVar1 = 10;
      goto LAB_00128d32;
    }
    item = (undefined8 *)nni_list_next(&nni_inproc.servers,item);
  } while( true );
}

Assistant:

static int
inproc_ep_bind(void *arg, nng_url *url)
{
	inproc_ep *ep = arg;
	inproc_ep *srch;
	nni_list  *list = &nni_inproc.servers;
	NNI_ARG_UNUSED(url);

	nni_mtx_lock(&nni_inproc.mx);
	NNI_LIST_FOREACH (list, srch) {
		if (strcmp(srch->addr, ep->addr) == 0) {
			nni_mtx_unlock(&nni_inproc.mx);
			return (NNG_EADDRINUSE);
		}
	}
	nni_list_append(list, ep);
	nni_mtx_unlock(&nni_inproc.mx);
	return (0);
}